

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

ssize_t httplib::detail::send_socket(socket_t sock,void *ptr,size_t size,int flags)

{
  anon_class_32_4_210d28e3 fn;
  ssize_t sVar1;
  int *in_stack_ffffffffffffffb8;
  void *local_40;
  void *ptr_local;
  size_t size_local;
  void **ppvStack_28;
  void **local_20;
  int *piStack_18;
  socket_t local_10;
  int local_c;
  socket_t sock_local;
  int flags_local;
  
  size_local = (size_t)&local_10;
  ppvStack_28 = &local_40;
  local_20 = &ptr_local;
  piStack_18 = &local_c;
  fn.ptr = local_20;
  fn.sock = (socket_t *)ppvStack_28;
  fn.size = (size_t *)piStack_18;
  fn.flags = in_stack_ffffffffffffffb8;
  local_40 = ptr;
  ptr_local = (void *)size;
  local_10 = sock;
  local_c = flags;
  sVar1 = handle_EINTR<httplib::detail::send_socket(int,void_const*,unsigned_long,int)::_lambda()_1_>
                    (fn);
  return sVar1;
}

Assistant:

inline ssize_t send_socket(socket_t sock, const void* ptr, size_t size,
            int flags) {
            return handle_EINTR([&]() {
                return send(sock,
                #ifdef _WIN32
                    static_cast<const char*>(ptr), static_cast<int>(size),
                #else
                    ptr, size,
                #endif
                    flags);
            });
        }